

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O1

UBool isSpecialTypeCodepoints(char *val)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = 0;
  do {
    bVar1 = *val;
    if (bVar1 == 0x2d) {
      if (iVar2 - 7U < 0xfffffffd) {
        return '\0';
      }
      iVar2 = 0;
    }
    else {
      if (bVar1 == 0) {
        return iVar2 - 4U < 3;
      }
      if (9 < (byte)(bVar1 - 0x30)) {
        if (0x25 < bVar1 - 0x41) {
          return '\0';
        }
        if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
          return '\0';
        }
      }
      iVar2 = iVar2 + 1;
    }
    val = (char *)((byte *)val + 1);
  } while( true );
}

Assistant:

static UBool
isSpecialTypeCodepoints(const char* val) {
    int32_t subtagLen = 0;
    const char* p = val;
    while (*p) {
        if (*p == '-') {
            if (subtagLen < 4 || subtagLen > 6) {
                return FALSE;
            }
            subtagLen = 0;
        } else if ((*p >= '0' && *p <= '9') ||
                    (*p >= 'A' && *p <= 'F') || // A-F/a-f are contiguous
                    (*p >= 'a' && *p <= 'f')) { // also in EBCDIC
            subtagLen++;
        } else {
            return FALSE;
        }
        p++;
    }
    return (subtagLen >= 4 && subtagLen <= 6);
}